

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O3

void av1_count_overlappable_neighbors(AV1_COMMON *cm,MACROBLOCKD *xd)

{
  int iVar1;
  MB_MODE_INFO **ppMVar2;
  MB_MODE_INFO *pMVar3;
  long lVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint8_t uVar12;
  long lVar13;
  uint uVar14;
  MB_MODE_INFO *pMVar15;
  
  ppMVar2 = xd->mi;
  pMVar3 = *ppMVar2;
  pMVar3->overlappable_neighbors = '\0';
  bVar5 = block_size_high[pMVar3->bsize];
  if (block_size_wide[pMVar3->bsize] < block_size_high[pMVar3->bsize]) {
    bVar5 = block_size_wide[pMVar3->bsize];
  }
  if (7 < bVar5) {
    if (xd->up_available == true) {
      iVar8 = xd->mi_col;
      uVar10 = (ulong)iVar8;
      iVar6 = (uint)xd->width + iVar8;
      iVar1 = (cm->mi_params).mi_cols;
      if (iVar1 <= iVar6) {
        iVar6 = iVar1;
      }
      if (iVar8 < iVar6) {
        lVar13 = (long)xd->mi_stride;
        uVar12 = '\0';
        iVar8 = 0;
        uVar11 = uVar10;
        do {
          uVar14 = (uint)uVar11;
          bVar5 = 0x10;
          if ((0x1f07ffUL >> ((ulong)ppMVar2[((int)uVar14 - lVar13) - uVar10]->bsize & 0x3f) & 1) !=
              0) {
            bVar5 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [ppMVar2[((int)uVar14 - lVar13) - uVar10]->bsize];
          }
          lVar4 = ((int)uVar14 - lVar13) - uVar10;
          uVar9 = uVar14 & 0xfffffffe;
          uVar7 = (uint)bVar5;
          if (bVar5 == 1) {
            uVar7 = 2;
            uVar14 = uVar9;
            lVar4 = (((long)(int)uVar9 + 1) - lVar13) - uVar10;
          }
          if (((ppMVar2[lVar4]->field_0xa7 & 0x80) != 0) || ('\0' < ppMVar2[lVar4]->ref_frame[0])) {
            iVar8 = iVar8 + 1;
            uVar12 = uVar12 + '\x01';
            pMVar3->overlappable_neighbors = uVar12;
          }
          uVar11 = (ulong)(uVar14 + uVar7);
        } while (((int)(uVar14 + uVar7) < iVar6) && (iVar8 != 0x7fffffff));
        if (uVar12 != '\0') {
          return;
        }
      }
    }
    if (xd->left_available == true) {
      iVar8 = xd->mi_row;
      uVar10 = (ulong)iVar8;
      iVar6 = (uint)xd->height + iVar8;
      iVar1 = (cm->mi_params).mi_rows;
      if (iVar1 <= iVar6) {
        iVar6 = iVar1;
      }
      if (iVar8 < iVar6) {
        ppMVar2 = xd->mi;
        lVar13 = (long)xd->mi_stride * uVar10;
        uVar12 = '\0';
        iVar8 = 0;
        do {
          uVar7 = (uint)uVar10;
          pMVar15 = ppMVar2[((long)(int)(xd->mi_stride * uVar7) + -1) - lVar13];
          uVar10 = (ulong)pMVar15->bsize;
          bVar5 = 0x10;
          uVar14 = uVar7;
          if ((0x2f0bffUL >> (uVar10 & 0x3f) & 1) != 0) {
            if ((0x20005UL >> (uVar10 & 0x3f) & 1) == 0) {
              bVar5 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                      [uVar10];
            }
            else {
              uVar14 = uVar7 & 0xfffffffe;
              pMVar15 = ppMVar2[((long)(int)(xd->mi_stride * (uVar7 | 1)) + -1) - lVar13];
              bVar5 = 2;
            }
          }
          if (((pMVar15->field_0xa7 & 0x80) != 0) || ('\0' < pMVar15->ref_frame[0])) {
            iVar8 = iVar8 + 1;
            uVar12 = uVar12 + '\x01';
            pMVar3->overlappable_neighbors = uVar12;
          }
          uVar10 = (ulong)(uVar14 + bVar5);
        } while (((int)(uVar14 + bVar5) < iVar6) && (iVar8 != 0x7fffffff));
      }
    }
  }
  return;
}

Assistant:

void av1_count_overlappable_neighbors(const AV1_COMMON *cm, MACROBLOCKD *xd) {
  MB_MODE_INFO *mbmi = xd->mi[0];

  mbmi->overlappable_neighbors = 0;

  if (!is_motion_variation_allowed_bsize(mbmi->bsize)) return;

  foreach_overlappable_nb_above(cm, xd, INT_MAX, increment_int_ptr,
                                &mbmi->overlappable_neighbors);
  if (mbmi->overlappable_neighbors) return;
  foreach_overlappable_nb_left(cm, xd, INT_MAX, increment_int_ptr,
                               &mbmi->overlappable_neighbors);
}